

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_heap.cpp
# Opt level: O0

bool __thiscall ON_SubDHeap::GrowFaceEdgeArray(ON_SubDHeap *this,ON_SubDFace *f,size_t capacity)

{
  ON_3dPoint *point_array;
  uint uVar1;
  ON__UINT_PTR *pOVar2;
  ulong point_capacity;
  ON_3dPoint *pOVar3;
  ON_3dPoint *pOVar4;
  ON_3dPoint *pOVar5;
  int local_74;
  ulong local_68;
  size_t i_1;
  size_t i;
  ON_3dPoint *texture_points1;
  ON_3dPoint *texture_points0;
  size_t texture_point_capacity1;
  ON__UINT_PTR *a;
  size_t xcapacity;
  size_t texture_point_capacity0;
  size_t capacity_local;
  ON_SubDFace *f_local;
  ON_SubDHeap *this_local;
  
  texture_point_capacity0 = capacity;
  capacity_local = (size_t)f;
  f_local = (ON_SubDFace *)this;
  if (f == (ON_SubDFace *)0x0) {
    ON_SubDIncrementErrorCount();
    this_local._7_1_ = false;
  }
  else {
    uVar1 = ON_SubDFace::TexturePointsCapacity(f);
    xcapacity = (size_t)uVar1;
    if (texture_point_capacity0 == 0) {
      texture_point_capacity0 = (size_t)(int)(*(ushort *)(capacity_local + 0x9c) + 1);
    }
    if ((ulong)(long)(int)(*(ushort *)(capacity_local + 0x9e) + 4) < texture_point_capacity0) {
      a = (ON__UINT_PTR *)(texture_point_capacity0 - 4);
      if (*(ushort *)(capacity_local + 0x9c) < 5) {
        local_74 = 0;
      }
      else {
        local_74 = *(ushort *)(capacity_local + 0x9c) - 4;
      }
      pOVar2 = ResizeArray(this,(long)local_74,(ulong)*(ushort *)(capacity_local + 0x9e),
                           *(ON__UINT_PTR **)(capacity_local + 0xc0),(size_t *)&a);
      if (pOVar2 == (ON__UINT_PTR *)0x0) {
        *(undefined2 *)(capacity_local + 0x9c) = 0;
        *(undefined2 *)(capacity_local + 0x9e) = 0;
        *(undefined8 *)(capacity_local + 0xc0) = 0;
        *(byte *)(capacity_local + 0x91) = *(byte *)(capacity_local + 0x91) & 0xfe;
        *(undefined8 *)(capacity_local + 200) = 0;
        ON_SubDIncrementErrorCount();
        this_local._7_1_ = false;
      }
      else {
        *(ON__UINT_PTR **)(capacity_local + 0xc0) = pOVar2;
        *(short *)(capacity_local + 0x9e) = (short)a;
        if ((xcapacity != 0) && (point_capacity = (long)a + 4, xcapacity < point_capacity)) {
          point_array = *(ON_3dPoint **)(capacity_local + 200);
          pOVar3 = Allocate3dPointArray(this,point_capacity);
          for (i_1 = 0; i_1 < xcapacity; i_1 = i_1 + 1) {
            pOVar5 = point_array + i_1;
            pOVar4 = pOVar3 + i_1;
            pOVar4->x = pOVar5->x;
            pOVar4->y = pOVar5->y;
            pOVar4->z = pOVar5->z;
          }
          for (local_68 = xcapacity; local_68 < point_capacity; local_68 = local_68 + 1) {
            pOVar4 = pOVar3 + local_68;
            pOVar4->x = ON_3dPoint::NanPoint.x;
            pOVar4->y = ON_3dPoint::NanPoint.y;
            pOVar4->z = ON_3dPoint::NanPoint.z;
          }
          *(ON_3dPoint **)(capacity_local + 200) = pOVar3;
          Return3dPointArray(this,point_array);
        }
        this_local._7_1_ = true;
      }
    }
    else {
      this_local._7_1_ = true;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool ON_SubDHeap::GrowFaceEdgeArray(
  ON_SubDFace* f,
  size_t capacity
  )
{
  if ( nullptr == f)
    return ON_SUBD_RETURN_ERROR(false);

  // The capacity of f->m_texture_points[] must always be 4 + f->m_edgex_capacity
  const size_t texture_point_capacity0 = f->TexturePointsCapacity();

  if ( 0 == capacity )
    capacity = f->m_edge_count+1;
  if ( capacity <= (size_t)(4 + f->m_edgex_capacity))
    return true;
  size_t xcapacity = capacity-4;
  ON__UINT_PTR* a = ResizeArray((f->m_edge_count>4) ? (f->m_edge_count-4) : 0,f->m_edgex_capacity,(ON__UINT_PTR*)f->m_edgex,&xcapacity);
  if ( nullptr == a )
  {
    f->m_edge_count = 0;
    f->m_edgex_capacity = 0;
    f->m_edgex = nullptr;
    // also remove texture points
    f->m_texture_status_bits &= ON_SubDFace::TextureStatusBits::NotTexturePointsBitsMask;
    f->m_texture_points = nullptr;
    return ON_SUBD_RETURN_ERROR(false);
  }
  f->m_edgex = (ON_SubDEdgePtr*)a;
  f->m_edgex_capacity = (unsigned short)xcapacity;
  if (texture_point_capacity0 > 0)
  {
    const size_t texture_point_capacity1 = 4 + xcapacity;
    if (texture_point_capacity0 < texture_point_capacity1)
    {
      ON_3dPoint* texture_points0 = f->m_texture_points;
      ON_3dPoint* texture_points1 = this->Allocate3dPointArray(texture_point_capacity1);
      for (size_t i = 0; i < texture_point_capacity0; ++i)
        texture_points1[i] = texture_points0[i];
      for (size_t i = texture_point_capacity0; i < texture_point_capacity1; ++i)
        texture_points1[i] = ON_3dPoint::NanPoint;
      f->m_texture_points = texture_points1;
      this->Return3dPointArray(texture_points0);
    }
  }
  return true;
}